

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkFile
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  Descriptor *pDVar1;
  FieldDescriptor *pFVar2;
  ServiceDescriptor *pSVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *proto_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *proto_02;
  long lVar4;
  int i_2;
  int i;
  long lVar5;
  
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < file->message_type_count_; lVar5 = lVar5 + 1) {
    pDVar1 = file->message_types_;
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,
                          (int)lVar5);
    CrossLinkMessage(this,(Descriptor *)(&pDVar1->super_SymbolBase + lVar4),proto_00);
    lVar4 = lVar4 + 0xa0;
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < file->extension_count_; lVar5 = lVar5 + 1) {
    pFVar2 = file->extensions_;
    proto_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,(int)lVar5)
    ;
    CrossLinkField(this,(FieldDescriptor *)(&pFVar2->super_SymbolBase + lVar4),proto_01);
    lVar4 = lVar4 + 0x58;
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < file->service_count_; lVar5 = lVar5 + 1) {
    pSVar3 = file->services_;
    proto_02 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                         (&(proto->field_0)._impl_.service_.super_RepeatedPtrFieldBase,(int)lVar5);
    CrossLinkService(this,(ServiceDescriptor *)(&pSVar3->super_SymbolBase + lVar4),proto_02);
    lVar4 = lVar4 + 0x40;
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkFile(FileDescriptor* file,
                                      const FileDescriptorProto& proto) {
  for (int i = 0; i < file->message_type_count(); i++) {
    CrossLinkMessage(&file->message_types_[i], proto.message_type(i));
  }

  for (int i = 0; i < file->extension_count(); i++) {
    CrossLinkField(&file->extensions_[i], proto.extension(i));
  }

  for (int i = 0; i < file->service_count(); i++) {
    CrossLinkService(&file->services_[i], proto.service(i));
  }
}